

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Points.cpp
# Opt level: O2

Point * __thiscall ezc3d::DataNS::Points3dNS::Points::point(Points *this,size_t idx)

{
  reference pvVar1;
  
  pvVar1 = std::
           vector<ezc3d::DataNS::Points3dNS::Point,_std::allocator<ezc3d::DataNS::Points3dNS::Point>_>
           ::at(&this->_points,idx);
  return pvVar1;
}

Assistant:

ezc3d::DataNS::Points3dNS::Point &
ezc3d::DataNS::Points3dNS::Points::point(size_t idx) {
  try {
    return _points.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Points::point method is trying to access the point " +
        std::to_string(idx) + " while the maximum number of points is " +
        std::to_string(nbPoints()) + ".");
  }
}